

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateExtensionRegistrationSource
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  reference ppEVar2;
  reference ppMVar3;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_38;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_30;
  iterator iter_1;
  __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
  local_20;
  iterator iter;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  iter._M_current = (ExtensionGenerator **)printer;
  local_20._M_current =
       (ExtensionGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
       ::begin(&this->extension_generators_);
  while( true ) {
    iter_1._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
         ::end(&this->extension_generators_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
                        *)&iter_1);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
              ::operator*(&local_20);
    ExtensionGenerator::GenerateRegistrationSource(*ppEVar2,(Printer *)iter._M_current);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
    ::operator++(&local_20);
  }
  local_30._M_current =
       (MessageGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
       ::begin(&this->nested_message_generators_);
  while( true ) {
    local_38._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
         ::end(&this->nested_message_generators_);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
              ::operator*(&local_30);
    GenerateExtensionRegistrationSource(*ppMVar3,(Printer *)iter._M_current);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateExtensionRegistrationSource(
    io::Printer* printer) {
  for (vector<ExtensionGenerator*>::iterator iter =
           extension_generators_.begin();
       iter != extension_generators_.end(); ++iter) {
    (*iter)->GenerateRegistrationSource(printer);
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateExtensionRegistrationSource(printer);
  }
}